

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

bool bloaty::BloatyMain(Options *options,InputFileFactory *file_factory,RollupOutput *output,
                       string *error)

{
  BloatyDoMain(options,file_factory,output);
  return true;
}

Assistant:

bool BloatyMain(const Options& options, const InputFileFactory& file_factory,
                RollupOutput* output, std::string* error) {
  try {
    BloatyDoMain(options, file_factory, output);
    return true;
  } catch (const bloaty::Error& e) {
    error->assign(e.what());
    return false;
  }
}